

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

int av1_compute_rd_mult(int qindex,aom_bit_depth_t bit_depth,FRAME_UPDATE_TYPE update_type,
                       int layer_depth,int boost_index,FRAME_TYPE frame_type,
                       int use_fixed_qp_offsets,int is_stat_consumption_stage,aom_tune_metric tuning
                       )

{
  int iVar1;
  int in_ECX;
  int in_R8D;
  char in_R9B;
  aom_tune_metric unaff_retaddr;
  int in_stack_00000008;
  FRAME_UPDATE_TYPE in_stack_0000000f;
  aom_bit_depth_t in_stack_00000010;
  int64_t rdmult;
  int local_2c;
  int local_28;
  long local_20;
  
  iVar1 = av1_compute_rd_mult_based_on_qindex
                    (in_stack_00000010,in_stack_0000000f,in_stack_00000008,unaff_retaddr);
  local_20 = (long)iVar1;
  if (((in_stack_00000010 != 0) && (in_stack_00000008 == 0)) && (in_R9B != '\0')) {
    local_20 = local_20 * rd_layer_depth_factor[in_ECX] >> 7;
    local_20 = (local_20 * rd_boost_factor[in_R8D] >> 7) + local_20;
  }
  if (local_20 < 1) {
    local_2c = 1;
  }
  else {
    if (local_20 < 0x7fffffff) {
      local_28 = (int)local_20;
    }
    else {
      local_28 = 0x7fffffff;
    }
    local_2c = local_28;
  }
  return local_2c;
}

Assistant:

int av1_compute_rd_mult(const int qindex, const aom_bit_depth_t bit_depth,
                        const FRAME_UPDATE_TYPE update_type,
                        const int layer_depth, const int boost_index,
                        const FRAME_TYPE frame_type,
                        const int use_fixed_qp_offsets,
                        const int is_stat_consumption_stage,
                        const aom_tune_metric tuning) {
  int64_t rdmult = av1_compute_rd_mult_based_on_qindex(bit_depth, update_type,
                                                       qindex, tuning);
  if (is_stat_consumption_stage && !use_fixed_qp_offsets &&
      (frame_type != KEY_FRAME)) {
    // Layer depth adjustment
    rdmult = (rdmult * rd_layer_depth_factor[layer_depth]) >> 7;
    // ARF boost adjustment
    rdmult += ((rdmult * rd_boost_factor[boost_index]) >> 7);
  }
  return rdmult > 0 ? (int)AOMMIN(rdmult, INT_MAX) : 1;
}